

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O0

void __thiscall Js::Utf8SourceInfo::EnsureLineOffsetCache(Utf8SourceInfo *this)

{
  LineOffsetCache **ppLVar1;
  LPCUTF8 puVar2;
  size_t sVar3;
  ScriptContext *this_00;
  Recycler *pRVar4;
  LineOffsetCache *this_01;
  TrackAllocData local_68;
  Recycler *local_40;
  Recycler *recycler;
  int64 byteStartOffset;
  LPCUTF8 puStack_28;
  charcount_t startChar;
  LPCUTF8 sourceAfterBOM;
  LPCUTF8 sourceEnd;
  LPCUTF8 sourceStart;
  Utf8SourceInfo *this_local;
  
  sourceStart = (LPCUTF8)this;
  ppLVar1 = Memory::WriteBarrierPtr::operator_cast_to_LineOffsetCache__
                      ((WriteBarrierPtr *)&this->m_lineOffsetCache);
  if (*ppLVar1 == (LineOffsetCache *)0x0) {
    puVar2 = GetSource(this,L"Utf8SourceInfo::AllocateLineOffsetCache");
    sourceEnd = puVar2;
    sVar3 = GetCbLength(this,L"Utf8SourceInfo::AllocateLineOffsetCache");
    sourceAfterBOM = puVar2 + sVar3;
    puStack_28 = sourceEnd;
    byteStartOffset._4_4_ = FunctionBody::SkipByteOrderMark(&stack0xffffffffffffffd8);
    recycler = (Recycler *)(puStack_28 + -(long)sourceEnd);
    this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->m_scriptContext);
    pRVar4 = ScriptContext::GetRecycler(this_00);
    local_40 = pRVar4;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_68,(type_info *)&LineOffsetCache::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
               ,0x10d);
    pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_68);
    this_01 = (LineOffsetCache *)new<Memory::Recycler>(0x10,pRVar4,0x43c4b0);
    LineOffsetCache::LineOffsetCache
              (this_01,local_40,puStack_28,sourceAfterBOM,byteStartOffset._4_4_,
               (charcount_t)recycler);
    Memory::WriteBarrierPtr<Js::LineOffsetCache>::operator=(&this->m_lineOffsetCache,this_01);
  }
  return;
}

Assistant:

void Utf8SourceInfo::EnsureLineOffsetCache()
    {
        if (this->m_lineOffsetCache == nullptr)
        {
            LPCUTF8 sourceStart = this->GetSource(_u("Utf8SourceInfo::AllocateLineOffsetCache"));
            LPCUTF8 sourceEnd = sourceStart + this->GetCbLength(_u("Utf8SourceInfo::AllocateLineOffsetCache"));

            LPCUTF8 sourceAfterBOM = sourceStart;
            charcount_t startChar = FunctionBody::SkipByteOrderMark(sourceAfterBOM /* byref */);
            int64 byteStartOffset = (sourceAfterBOM - sourceStart);

            Recycler* recycler = this->m_scriptContext->GetRecycler();
            this->m_lineOffsetCache = RecyclerNew(recycler, LineOffsetCache, recycler, sourceAfterBOM, sourceEnd, startChar, (int)byteStartOffset);
        }
    }